

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

LY_ERR lyds_merge_nodes1(lyd_node **first_dst,lyd_node **leader_dst,lyd_meta *root_meta_dst,
                        rb_node *rbt_dst,lyd_node **first_src,lyd_node *leader_src,lyd_node **next_p
                        )

{
  lysc_node *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  rb_node *rbn;
  lysc_type_bitenum_item *local_48;
  lyd_node **local_40;
  rb_node *local_38;
  
  plVar1 = leader_src->schema;
  local_48 = (lysc_type_bitenum_item *)rbt_dst;
  local_40 = first_src;
  while ((leader_src != (lyd_node *)0x0 && (leader_src->schema == plVar1))) {
    LVar3 = rb_insert(leader_src,(rb_node **)&local_48,&local_38);
    if (LVar3 != LY_SUCCESS) break;
    plVar2 = leader_src->next;
    lyd_unlink_ignore_lyds(local_40,leader_src);
    lyds_link_data_node(first_dst,leader_dst,leader_src,root_meta_dst,local_38);
    lyd_insert_hash(leader_src);
    leader_src = plVar2;
  }
  *next_p = leader_src;
  (root_meta_dst->value).field_2.enum_item = local_48;
  return (LY_ERR)local_48;
}

Assistant:

static LY_ERR
lyds_merge_nodes1(struct lyd_node **first_dst, struct lyd_node **leader_dst, struct lyd_meta *root_meta_dst,
        struct rb_node *rbt_dst, struct lyd_node **first_src, struct lyd_node *leader_src, struct lyd_node **next_p)
{
    LY_ERR ret;
    struct rb_node *rbn;
    struct lyd_node *iter, *next;
    const struct lysc_node *schema;

    schema = leader_src->schema;
    for (iter = leader_src; iter && (iter->schema == schema); iter = next) {
        ret = rb_insert(iter, &rbt_dst, &rbn);
        if (ret) {
            /* allocation failed, @p next_p must refer to failed node */
            break;
        }
        next = iter->next;
        lyd_unlink_ignore_lyds(first_src, iter);
        lyds_link_data_node(first_dst, leader_dst, iter, root_meta_dst, rbn);
        lyd_insert_hash(iter);
    }
    *next_p = iter;

    RBT_SET(root_meta_dst, rbt_dst);

    return LY_SUCCESS;
}